

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

Fts5ExprPhrase *
sqlite3Fts5ParseTerm(Fts5Parse *pParse,Fts5ExprPhrase *pAppend,Fts5Token *pToken,int bPrefix)

{
  Fts5Config *pConfig;
  int iVar1;
  byte *z;
  size_t sVar2;
  Fts5ExprPhrase *pFVar3;
  long in_FS_OFFSET;
  int rc;
  Fts5ExprPhrase *local_58;
  Fts5Config *local_50;
  undefined8 local_48;
  int local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pConfig = pParse->pConfig;
  local_48 = 0;
  local_3c = 0;
  local_58 = pAppend;
  local_50 = pConfig;
  z = (byte *)sqlite3Fts5Strndup(&local_3c,pToken->p,pToken->n);
  iVar1 = local_3c;
  if (local_3c == 0) {
    if ((*z - 0x22 < 0x3f) && ((0x4200000000000021U >> ((ulong)(*z - 0x22) & 0x3f) & 1) != 0)) {
      fts5Dequote((char *)z);
    }
    sVar2 = strlen((char *)z);
    iVar1 = sqlite3Fts5Tokenize(pConfig,(uint)(bPrefix != 0) * 2 + 1,(char *)z,(int)sVar2,&local_58,
                                fts5ParseTokenize);
    sqlite3_free(z);
    if ((iVar1 != 0) || (iVar1 = (int)local_48, (int)local_48 != 0)) goto LAB_001df419;
    if (pAppend != (Fts5ExprPhrase *)0x0) {
LAB_001df44c:
      if (local_58 == (Fts5ExprPhrase *)0x0) {
        local_58 = (Fts5ExprPhrase *)sqlite3Fts5MallocZero(&pParse->rc,0x48);
      }
      else if ((long)local_58->nTerm != 0) {
        local_58->aTerm[(long)local_58->nTerm + -1].bPrefix = (u8)bPrefix;
      }
      pParse->apPhrase[(long)pParse->nPhrase + -1] = local_58;
      pFVar3 = local_58;
      goto LAB_001df428;
    }
    iVar1 = parseGrowPhraseArray(pParse);
    if (iVar1 == 0) {
      pParse->nPhrase = pParse->nPhrase + 1;
      goto LAB_001df44c;
    }
  }
  else {
    sqlite3_free(z);
LAB_001df419:
    pParse->rc = iVar1;
  }
  fts5ExprPhraseFree(local_58);
  pFVar3 = (Fts5ExprPhrase *)0x0;
LAB_001df428:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return pFVar3;
  }
  __stack_chk_fail();
}

Assistant:

static Fts5ExprPhrase *sqlite3Fts5ParseTerm(
  Fts5Parse *pParse,              /* Parse context */
  Fts5ExprPhrase *pAppend,        /* Phrase to append to */
  Fts5Token *pToken,              /* String to tokenize */
  int bPrefix                     /* True if there is a trailing "*" */
){
  Fts5Config *pConfig = pParse->pConfig;
  TokenCtx sCtx;                  /* Context object passed to callback */
  int rc;                         /* Tokenize return code */
  char *z = 0;

  memset(&sCtx, 0, sizeof(TokenCtx));
  sCtx.pPhrase = pAppend;
  sCtx.pConfig = pConfig;

  rc = fts5ParseStringFromToken(pToken, &z);
  if( rc==SQLITE_OK ){
    int flags = FTS5_TOKENIZE_QUERY | (bPrefix ? FTS5_TOKENIZE_PREFIX : 0);
    int n;
    sqlite3Fts5Dequote(z);
    n = (int)strlen(z);
    rc = sqlite3Fts5Tokenize(pConfig, flags, z, n, &sCtx, fts5ParseTokenize);
  }
  sqlite3_free(z);
  if( rc || (rc = sCtx.rc) ){
    pParse->rc = rc;
    fts5ExprPhraseFree(sCtx.pPhrase);
    sCtx.pPhrase = 0;
  }else{

    if( pAppend==0 ){
      if( parseGrowPhraseArray(pParse) ){
        fts5ExprPhraseFree(sCtx.pPhrase);
        return 0;
      }
      pParse->nPhrase++;
    }

    if( sCtx.pPhrase==0 ){
      /* This happens when parsing a token or quoted phrase that contains
      ** no token characters at all. (e.g ... MATCH '""'). */
      sCtx.pPhrase = sqlite3Fts5MallocZero(&pParse->rc, sizeof(Fts5ExprPhrase));
    }else if( sCtx.pPhrase->nTerm ){
      sCtx.pPhrase->aTerm[sCtx.pPhrase->nTerm-1].bPrefix = (u8)bPrefix;
    }
    assert( pParse->apPhrase!=0 );
    pParse->apPhrase[pParse->nPhrase-1] = sCtx.pPhrase;
  }

  return sCtx.pPhrase;
}